

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm_fpu.cpp
# Opt level: O0

void EBPLM::PredictStateOnYFace
               (Box *yebox,int ncomp,Array4<double> *Imy,Array4<double> *Ipy,Array4<const_double> *q
               ,Array4<const_double> *vmac,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc,
               bool is_velocity)

{
  int iVar1;
  int iVar2;
  void *in_RCX;
  void *in_RDX;
  Box *in_RDI;
  void *in_R8;
  void *in_R9;
  double in_XMM0_Qa;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  Geometry *in_stack_00000038;
  byte in_stack_00000050;
  bool has_extdir_or_ho_hi_z;
  bool has_extdir_or_ho_lo_z;
  pair<bool,_bool> extdir_lohi_z;
  int domain_khi;
  int domain_klo;
  bool has_extdir_or_ho_hi_y;
  bool has_extdir_or_ho_lo_y;
  bool has_extdir_or_ho_hi_x;
  bool has_extdir_or_ho_lo_x;
  pair<bool,_bool> extdir_lohi_y;
  pair<bool,_bool> extdir_lohi_x;
  int domain_jhi;
  int domain_jlo;
  int domain_ihi;
  int domain_ilo;
  Box *domain_box;
  Real dtdy;
  Real dy;
  int in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  BCRec *in_stack_fffffffffffff9f0;
  undefined1 local_5e8 [8];
  anon_class_696_20_7cd5c56d *in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa2c;
  Box *in_stack_fffffffffffffa30;
  undefined1 auStack_5a8 [64];
  int local_568;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  undefined1 auStack_550 [64];
  undefined1 auStack_510 [64];
  double local_4d0;
  double local_4c8;
  undefined1 auStack_4b8 [64];
  undefined1 auStack_478 [64];
  undefined1 auStack_438 [64];
  undefined1 auStack_3f8 [64];
  undefined1 auStack_3b8 [64];
  undefined1 auStack_378 [64];
  byte local_338;
  undefined1 local_330 [64];
  undefined1 auStack_2f0 [64];
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  undefined1 auStack_298 [64];
  undefined1 auStack_258 [64];
  double local_218;
  undefined1 auStack_208 [64];
  undefined1 auStack_1c8 [64];
  undefined1 auStack_188 [64];
  undefined1 auStack_148 [64];
  undefined1 auStack_108 [64];
  undefined1 auStack_c8 [64];
  byte local_88;
  byte local_7c;
  byte local_7b;
  pair<bool,_bool> local_7a;
  int local_78;
  int local_74;
  byte local_70;
  byte local_6f;
  byte local_6e;
  byte local_6d;
  pair<bool,_bool> local_6c;
  pair<bool,_bool> local_6a;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Box *local_58;
  double local_50;
  Real local_48;
  byte local_39;
  double local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  Box *local_8;
  
  local_39 = in_stack_00000050 & 1;
  local_38 = in_XMM0_Qa;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_48 = amrex::CoordSys::CellSize(&in_stack_00000038->super_CoordSys,1);
  local_50 = local_38 / local_48;
  local_58 = amrex::Geometry::Domain(in_stack_00000038);
  local_5c = amrex::Box::smallEnd(local_58,0);
  local_60 = amrex::Box::bigEnd(local_58,0);
  local_64 = amrex::Box::smallEnd(local_58,1);
  local_68 = amrex::Box::bigEnd(local_58,1);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x9b091d);
  local_6a = anon_unknown.dwarf_6946cf::has_extdir_or_ho
                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                        in_stack_fffffffffffff9e8);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x9b0943);
  local_6c = anon_unknown.dwarf_6946cf::has_extdir_or_ho
                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                        in_stack_fffffffffffff9e8);
  local_6d = local_6a.first & 1;
  local_6e = local_6a.second & 1;
  local_6f = local_6c.first & 1;
  local_70 = local_6c.second & 1;
  local_74 = amrex::Box::smallEnd(local_58,2);
  local_78 = amrex::Box::bigEnd(local_58,2);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x9b09de);
  local_7a = anon_unknown.dwarf_6946cf::has_extdir_or_ho
                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                        in_stack_fffffffffffff9e8);
  iVar1 = local_5c;
  local_7b = local_7a.first & 1;
  local_7c = local_7a.second & 1;
  if ((local_6d & 1) == 0) {
LAB_009b0a4f:
    iVar1 = local_60;
    if ((local_6e & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,0);
      if (iVar1 <= iVar2) goto LAB_009b0b57;
    }
    iVar1 = local_74;
    if ((local_7b & 1) != 0) {
      iVar2 = amrex::Box::smallEnd(local_8,2);
      if (iVar2 + -1 <= iVar1) goto LAB_009b0b57;
    }
    iVar1 = local_78;
    if ((local_7c & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,2);
      if (iVar1 <= iVar2) goto LAB_009b0b57;
    }
    iVar1 = local_64;
    if ((local_6f & 1) != 0) {
      iVar2 = amrex::Box::smallEnd(local_8,1);
      if (iVar2 + -1 <= iVar1) goto LAB_009b0b57;
    }
    iVar1 = local_68;
    if ((local_70 & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,1);
      if (iVar1 <= iVar2) goto LAB_009b0b57;
    }
    memcpy(local_5e8,local_28,0x3c);
    memcpy(auStack_5a8,local_30,0x3c);
    local_568 = local_5c;
    local_564 = local_64;
    local_560 = local_74;
    local_55c = local_60;
    local_558 = local_68;
    local_554 = local_78;
    memcpy(auStack_550,local_18,0x3c);
    memcpy(auStack_510,local_20,0x3c);
    local_4d0 = local_38;
    local_4c8 = local_50;
    memcpy(auStack_4b8,in_stack_00000008,0x3c);
    memcpy(auStack_478,in_stack_00000010,0x3c);
    memcpy(auStack_438,in_stack_00000030,0x3c);
    memcpy(auStack_3f8,in_stack_00000018,0x3c);
    memcpy(auStack_3b8,in_stack_00000020,0x3c);
    memcpy(auStack_378,in_stack_00000028,0x3c);
    local_338 = local_39 & 1;
    amrex::
    ParallelFor<int,EBPLM::PredictStateOnYFace(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__1,void>
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,in_stack_fffffffffffffa20);
  }
  else {
    iVar2 = amrex::Box::smallEnd(local_8,0);
    if (iVar1 < iVar2 + -1) goto LAB_009b0a4f;
LAB_009b0b57:
    memcpy(local_330,local_28,0x3c);
    memcpy(auStack_2f0,local_30,0x3c);
    local_2b0 = local_5c;
    local_2ac = local_64;
    local_2a8 = local_74;
    local_2a4 = local_60;
    local_2a0 = local_68;
    local_29c = local_78;
    memcpy(auStack_298,local_18,0x3c);
    memcpy(auStack_258,local_20,0x3c);
    local_218 = local_50;
    memcpy(auStack_208,in_stack_00000008,0x3c);
    memcpy(auStack_1c8,in_stack_00000010,0x3c);
    memcpy(auStack_188,in_stack_00000030,0x3c);
    memcpy(auStack_148,in_stack_00000018,0x3c);
    memcpy(auStack_108,in_stack_00000020,0x3c);
    memcpy(auStack_c8,in_stack_00000028,0x3c);
    local_88 = local_39 & 1;
    amrex::
    ParallelFor<int,EBPLM::PredictStateOnYFace(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__0,void>
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
               (anon_class_688_19_b0541dda *)in_stack_fffffffffffffa20);
  }
  return;
}

Assistant:

void
EBPLM::PredictStateOnYFace ( Box const& yebox, int ncomp,
                             Array4<Real> const& Imy, Array4<Real> const& Ipy,
                             Array4<Real const> const& q,
                             Array4<Real const> const& vmac,
                             Array4<EBCellFlag const> const& flag,
                             Array4<Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             Geometry const& geom,
                             Real dt,
                             Vector<BCRec> const& h_bcrec,
                             BCRec const* pbc, bool is_velocity)
{
    const Real dy = geom.CellSize(1);
    const Real dtdy = dt/dy;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= yebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= yebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= yebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= yebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= yebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= yebox.bigEnd(1)    )  )
    {
        amrex::ParallelFor(yebox, ncomp, [q,vmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                          vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 + ccc(i,j,k,1);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_z = zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_hi[1];

                }  // end of making qpls

                // Only over-write normal velocity with Dirichlet bc at lo face
                if (j == domain_jlo && (bc.lo(1) == BCType::ext_dir))
                    if (is_velocity && n == 1) qpls = q(i,j-1,k,n);

                // Over-write all with Dirichlet bc at hi face
                if (j == domain_jhi+1 && (bc.hi(1) == BCType::ext_dir))
                    qpls = q(i,j,k,n);

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                            vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_lo[1];

                }  // end of making qmns

                // Over-write all with Dirichlet bc at lo face
                if (j == domain_jlo && (bc.lo(1) == BCType::ext_dir))
                    qmns = q(i,j-1,k,n);

                // Only over-write normal velocity with Dirichlet bc at hi face
                if (j == domain_jhi+1 && (bc.hi(1) == BCType::ext_dir))
                    if (is_velocity && n == 1) qmns = q(i,j,k,n);
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(yebox, ncomp, [q,vmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dt,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                          vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 + ccc(i,j,k,1);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_z = zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) - delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                            vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - vmac(i,j,k) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdy * vmac(i,j,k) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
}